

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O0

void test_arming_success(void)

{
  cio_error cVar1;
  undefined1 local_48 [4];
  cio_error err;
  cio_timer timer;
  
  timerfd_create_fake.return_val = 5;
  read_fake.return_val = 8;
  cVar1 = cio_timer_init((cio_timer *)local_48,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x168,UNITY_DISPLAY_STYLE_INT);
  cio_timer_expires_from_now((cio_timer *)local_48,2000,handle_timeout,(void *)0x0);
  UnityAssertEqualNumber
            (1,(ulong)handle_timeout_fake.call_count,(char *)0x0,0x16c,UNITY_DISPLAY_STYLE_INT);
  if (handle_timeout_fake.arg2_val == CIO_SUCCESS) {
    UnityAssertEqualNumber
              ((UNITY_INT)local_48,(UNITY_INT)handle_timeout_fake.arg0_val,(char *)0x0,0x16e,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",0x16d);
}

Assistant:

static void test_arming_success(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;
	read_fake.return_val = sizeof(uint64_t);

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	cio_timer_expires_from_now(&timer, 2000, handle_timeout, NULL);

	TEST_ASSERT_EQUAL(1, handle_timeout_fake.call_count);
	TEST_ASSERT(handle_timeout_fake.arg2_val == CIO_SUCCESS);
	TEST_ASSERT_EQUAL(&timer, handle_timeout_fake.arg0_val);
}